

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BipedFootContactClassifier.cpp
# Opt level: O3

void __thiscall
iDynTree::BipedFootContactClassifier::detectFeetTransition(BipedFootContactClassifier *this)

{
  SwitchingPattern SVar1;
  contactFoot cVar2;
  contactTransition cVar3;
  contactTransition cVar4;
  
  cVar3 = ContactStateMachine::contactTransitionMode
                    ((this->m_leftFootContactClassifier)._M_t.
                     super___uniq_ptr_impl<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_iDynTree::ContactStateMachine_*,_std::default_delete<iDynTree::ContactStateMachine>_>
                     .super__Head_base<0UL,_iDynTree::ContactStateMachine_*,_false>._M_head_impl);
  cVar4 = ContactStateMachine::contactTransitionMode
                    ((this->m_rightFootContactClassifier)._M_t.
                     super___uniq_ptr_impl<iDynTree::ContactStateMachine,_std::default_delete<iDynTree::ContactStateMachine>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_iDynTree::ContactStateMachine_*,_std::default_delete<iDynTree::ContactStateMachine>_>
                     .super__Head_base<0UL,_iDynTree::ContactStateMachine_*,_false>._M_head_impl);
  SVar1 = this->m_pattern;
  if ((SVar1 != DEFAULT_CONTACT) && (SVar1 != LATEST_ACTIVE_CONTACT)) {
    if (SVar1 != ALTERNATE_CONTACT) {
      return;
    }
    cVar2 = this->m_primaryFoot;
    if (cVar2 == UNKNOWN_FOOT) {
      if ((cVar3 & ~CONTACT_BREAK) != STABLE_ONCONTACT) {
        if ((cVar4 & ~CONTACT_BREAK) != STABLE_ONCONTACT) {
          return;
        }
        goto LAB_00151994;
      }
    }
    else if (cVar2 == RIGHT_FOOT) {
      if ((cVar3 != CONTACT_MAKE) || (this->m_rightFootContactState != true)) {
        if (cVar3 != STABLE_ONCONTACT && cVar4 != STABLE_ONCONTACT) {
          if (cVar4 != STABLE_OFFCONTACT) {
            return;
          }
          this->m_primaryFoot = (uint)(cVar3 == STABLE_OFFCONTACT) * 2;
          return;
        }
        goto LAB_00151994;
      }
    }
    else {
      if (cVar2 != LEFT_FOOT) {
        return;
      }
      if ((cVar4 == CONTACT_MAKE) && (this->m_leftFootContactState == true)) {
LAB_00151994:
        this->m_primaryFoot = RIGHT_FOOT;
        return;
      }
      if (cVar3 != STABLE_ONCONTACT && cVar4 != STABLE_ONCONTACT) {
        if (cVar3 != STABLE_OFFCONTACT) {
          return;
        }
        this->m_primaryFoot = (cVar4 == STABLE_OFFCONTACT) + RIGHT_FOOT;
        return;
      }
    }
  }
  this->m_primaryFoot = LEFT_FOOT;
  return;
}

Assistant:

void BipedFootContactClassifier::detectFeetTransition()
{
    ContactStateMachine::contactTransition leftFootTransition = m_leftFootContactClassifier.get()->contactTransitionMode();
    ContactStateMachine::contactTransition rightFootTransition = m_rightFootContactClassifier.get()->contactTransitionMode();
    
    switch (m_pattern)
    {
        case SwitchingPattern::ALTERNATE_CONTACT:
            if (m_primaryFoot == LEFT_FOOT)
            {                
                if ( rightFootTransition == ContactStateMachine::CONTACT_MAKE && m_leftFootContactState == true)
                {
                    m_primaryFoot = RIGHT_FOOT; 
                }
                else if (leftFootTransition == ContactStateMachine::STABLE_ONCONTACT || rightFootTransition == ContactStateMachine::STABLE_ONCONTACT)
                {
                    m_primaryFoot = LEFT_FOOT;
                }
                else if (leftFootTransition == ContactStateMachine::STABLE_OFFCONTACT)
                {
                    m_primaryFoot = RIGHT_FOOT;
                    if (rightFootTransition == ContactStateMachine::STABLE_OFFCONTACT)
                    {
                        m_primaryFoot = UNKNOWN_FOOT;
                    }
                }
            }
            else if (m_primaryFoot == RIGHT_FOOT)
            {                
                if ( leftFootTransition == ContactStateMachine::CONTACT_MAKE && m_rightFootContactState == true)
                {
                    m_primaryFoot = LEFT_FOOT;
                }
                
                else if (rightFootTransition == ContactStateMachine::STABLE_ONCONTACT || leftFootTransition == ContactStateMachine::STABLE_ONCONTACT)
                {
                    m_primaryFoot = RIGHT_FOOT;
                }
                
                else if (rightFootTransition == ContactStateMachine::STABLE_OFFCONTACT)
                {
                    m_primaryFoot = LEFT_FOOT;
                    if (leftFootTransition == ContactStateMachine::STABLE_OFFCONTACT)
                    {
                        m_primaryFoot = UNKNOWN_FOOT;
                    }
                }
            }
            else if (m_primaryFoot == UNKNOWN_FOOT)
            {
                // check if left foot has become active first, then check right foot
                if (leftFootTransition == ContactStateMachine::CONTACT_MAKE || leftFootTransition == ContactStateMachine::STABLE_ONCONTACT)
                {
                    m_primaryFoot = LEFT_FOOT;
                }
                else if (rightFootTransition == ContactStateMachine::CONTACT_MAKE || rightFootTransition == ContactStateMachine::STABLE_ONCONTACT)
                {
                    m_primaryFoot = RIGHT_FOOT;
                }
            }
            break;
            
        case SwitchingPattern::LATEST_ACTIVE_CONTACT:
            m_primaryFoot = LEFT_FOOT;
            break;
            
        case SwitchingPattern::DEFAULT_CONTACT:
            m_primaryFoot = LEFT_FOOT;
            break;
    }
}